

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpInputStream::Response> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readResponse
          (HttpInputStreamImpl *this,HttpMethod requestMethod)

{
  Coroutine<kj::HttpInputStream::Response> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar1;
  undefined4 uVar2;
  long lVar3;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> handle;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_40 [2];
  undefined4 local_38;
  
  handle._M_fr_ptr = operator_new(0x4e8);
  *(code **)handle._M_fr_ptr = readResponse;
  *(code **)((long)handle._M_fr_ptr + 8) = readResponse;
  this_00 = (Coroutine<kj::HttpInputStream::Response> *)((long)handle._M_fr_ptr + 0x10);
  *(undefined4 *)((long)handle._M_fr_ptr + 0x4e0) = in_EDX;
  *(ulong *)((long)handle._M_fr_ptr + 0x4d8) = CONCAT44(in_register_00000034,requestMethod);
  location.function = "readResponse";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x5a5;
  location.columnNumber = 0x19;
  kj::_::Coroutine<kj::HttpInputStream::Response>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<kj::HttpInputStream::Response>::get_return_object
            ((Coroutine<kj::HttpInputStream::Response> *)this);
  this_01 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x4d0);
  readResponseHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)handle._M_fr_ptr + 0x268);
  co_await<kj::OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
             this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x4e4) = 0;
  bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar4) {
    kj::_::PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
    await_resume((OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)
                 ((long)handle._M_fr_ptr + 0x460),__return_storage_ptr__);
    kj::_::PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::
    ~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
    if (((OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *)
        ((long)handle._M_fr_ptr + 0x460))->tag != 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13]>
                ((Fault *)&body,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5a8,FAILED,"responseOrProtocolError.tryGet<HttpHeaders::Response>() != nullptr",
                 "\"bad response\"",(char (*) [13])"bad response");
      kj::_::Debug::Fault::fatal((Fault *)&body);
    }
    local_38 = *(undefined4 *)((long)handle._M_fr_ptr + 0x4e0);
    lVar3 = *(long *)((long)handle._M_fr_ptr + 0x4d8);
    uVar1 = *(uint *)((long)handle._M_fr_ptr + 0x468);
    uVar2 = *(undefined4 *)((long)handle._M_fr_ptr + 0x47c);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)((long)handle._M_fr_ptr + 0x46c) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)((long)handle._M_fr_ptr + 0x474);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)((long)handle._M_fr_ptr + 0x474) >> 0x20);
    local_40[0] = 1;
    getEntityBody((HttpInputStreamImpl *)&body,(RequestOrResponse)lVar3,
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x1,(uint)local_40,
                  (HttpHeaders *)(ulong)uVar1);
    local_40[0] = 0;
    *(uint *)((long)handle._M_fr_ptr + 0x4a0) = uVar1;
    *(ulong *)((long)handle._M_fr_ptr + 0x4a8) = CONCAT44(uStack_60,uStack_64);
    *(ulong *)((long)handle._M_fr_ptr + 0x4b0) = CONCAT44(uVar2,uStack_5c);
    *(long *)((long)handle._M_fr_ptr + 0x4b8) = lVar3 + 0x48;
    *(Disposer **)((long)handle._M_fr_ptr + 0x4c0) = body.disposer;
    *(AsyncInputStream **)((long)handle._M_fr_ptr + 0x4c8) = body.ptr;
    body.ptr = (AsyncInputStream *)0x0;
    kj::_::Coroutine<kj::HttpInputStream::Response>::fulfill
              (this_00,(FixVoid<kj::HttpInputStream::Response> *)((long)handle._M_fr_ptr + 0x4a0));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x4c0));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose(&body);
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x4e4) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Response> readResponse(HttpMethod requestMethod) override {
    auto responseOrProtocolError = co_await readResponseHeaders();
    auto response = KJ_REQUIRE_NONNULL(
        responseOrProtocolError.tryGet<HttpHeaders::Response>(), "bad response");
    auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, requestMethod,
                              response.statusCode, headers);

    co_return { response.statusCode, response.statusText, headers, kj::mv(body) };
  }